

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall sglr::ReferenceContext::~ReferenceContext(ReferenceContext *this)

{
  pointer ppTVar1;
  vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_> vertexArrays;
  _Vector_base<sglr::rc::Texture_*,_std::allocator<sglr::rc::Texture_*>_> local_28;
  
  (this->super_Context)._vptr_Context = (_func_int **)&PTR__ReferenceContext_00c439c8;
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rc::ObjectManager<sglr::rc::VertexArray>::getAll
            (&this->m_vertexArrays,
             (vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_> *)&local_28)
  ;
  for (ppTVar1 = local_28._M_impl.super__Vector_impl_data._M_start;
      ppTVar1 != local_28._M_impl.super__Vector_impl_data._M_finish; ppTVar1 = ppTVar1 + 1) {
    deleteVertexArray(this,(VertexArray *)*ppTVar1);
  }
  std::_Vector_base<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>::
  ~_Vector_base((_Vector_base<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_> *)
                &local_28);
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rc::ObjectManager<sglr::rc::Texture>::getAll
            (&this->m_textures,
             (vector<sglr::rc::Texture_*,_std::allocator<sglr::rc::Texture_*>_> *)&local_28);
  for (ppTVar1 = local_28._M_impl.super__Vector_impl_data._M_start;
      ppTVar1 != local_28._M_impl.super__Vector_impl_data._M_finish; ppTVar1 = ppTVar1 + 1) {
    deleteTexture(this,*ppTVar1);
  }
  std::_Vector_base<sglr::rc::Texture_*,_std::allocator<sglr::rc::Texture_*>_>::~_Vector_base
            (&local_28);
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rc::ObjectManager<sglr::rc::Framebuffer>::getAll
            (&this->m_framebuffers,
             (vector<sglr::rc::Framebuffer_*,_std::allocator<sglr::rc::Framebuffer_*>_> *)&local_28)
  ;
  for (ppTVar1 = local_28._M_impl.super__Vector_impl_data._M_start;
      ppTVar1 != local_28._M_impl.super__Vector_impl_data._M_finish; ppTVar1 = ppTVar1 + 1) {
    deleteFramebuffer(this,(Framebuffer *)*ppTVar1);
  }
  std::_Vector_base<sglr::rc::Framebuffer_*,_std::allocator<sglr::rc::Framebuffer_*>_>::
  ~_Vector_base((_Vector_base<sglr::rc::Framebuffer_*,_std::allocator<sglr::rc::Framebuffer_*>_> *)
                &local_28);
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rc::ObjectManager<sglr::rc::Renderbuffer>::getAll
            (&this->m_renderbuffers,
             (vector<sglr::rc::Renderbuffer_*,_std::allocator<sglr::rc::Renderbuffer_*>_> *)
             &local_28);
  for (ppTVar1 = local_28._M_impl.super__Vector_impl_data._M_start;
      ppTVar1 != local_28._M_impl.super__Vector_impl_data._M_finish; ppTVar1 = ppTVar1 + 1) {
    deleteRenderbuffer(this,(Renderbuffer *)*ppTVar1);
  }
  std::_Vector_base<sglr::rc::Renderbuffer_*,_std::allocator<sglr::rc::Renderbuffer_*>_>::
  ~_Vector_base((_Vector_base<sglr::rc::Renderbuffer_*,_std::allocator<sglr::rc::Renderbuffer_*>_> *
                )&local_28);
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rc::ObjectManager<sglr::rc::DataBuffer>::getAll
            (&this->m_buffers,
             (vector<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_> *)&local_28);
  for (ppTVar1 = local_28._M_impl.super__Vector_impl_data._M_start;
      ppTVar1 != local_28._M_impl.super__Vector_impl_data._M_finish; ppTVar1 = ppTVar1 + 1) {
    deleteBuffer(this,(DataBuffer *)*ppTVar1);
  }
  std::_Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>::~_Vector_base
            ((_Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_> *)
             &local_28);
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rc::ObjectManager<sglr::rc::ShaderProgramObjectContainer>::getAll
            (&this->m_programs,
             (vector<sglr::rc::ShaderProgramObjectContainer_*,_std::allocator<sglr::rc::ShaderProgramObjectContainer_*>_>
              *)&local_28);
  for (ppTVar1 = local_28._M_impl.super__Vector_impl_data._M_start;
      ppTVar1 != local_28._M_impl.super__Vector_impl_data._M_finish; ppTVar1 = ppTVar1 + 1) {
    deleteProgramObject(this,(ShaderProgramObjectContainer *)*ppTVar1);
  }
  std::
  _Vector_base<sglr::rc::ShaderProgramObjectContainer_*,_std::allocator<sglr::rc::ShaderProgramObjectContainer_*>_>
  ::~_Vector_base((_Vector_base<sglr::rc::ShaderProgramObjectContainer_*,_std::allocator<sglr::rc::ShaderProgramObjectContainer_*>_>
                   *)&local_28);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&(this->m_fragmentDepths).super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>::~_Vector_base
            (&(this->m_fragmentBuffer).
              super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>);
  std::_Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>::~_Vector_base
            (&(this->m_currentAttribs).
              super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>);
  rc::TextureCubeArray::~TextureCubeArray(&this->m_emptyTexCubeArray);
  rc::Texture3D::~Texture3D(&this->m_emptyTex3D);
  rc::Texture2DArray::~Texture2DArray(&this->m_emptyTex2DArray);
  rc::TextureCube::~TextureCube(&this->m_emptyTexCube);
  rc::Texture2D::~Texture2D(&this->m_emptyTex2D);
  rc::Texture1D::~Texture1D(&this->m_emptyTex1D);
  std::
  vector<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
  ::~vector(&this->m_textureUnits);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_sglr::rc::ShaderProgramObjectContainer_*>,_std::_Select1st<std::pair<const_unsigned_int,_sglr::rc::ShaderProgramObjectContainer_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sglr::rc::ShaderProgramObjectContainer_*>_>_>
  ::~_Rb_tree(&(this->m_programs).m_objects._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_sglr::rc::VertexArray_*>,_std::_Select1st<std::pair<const_unsigned_int,_sglr::rc::VertexArray_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sglr::rc::VertexArray_*>_>_>
  ::~_Rb_tree(&(this->m_vertexArrays).m_objects._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_sglr::rc::DataBuffer_*>,_std::_Select1st<std::pair<const_unsigned_int,_sglr::rc::DataBuffer_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sglr::rc::DataBuffer_*>_>_>
  ::~_Rb_tree(&(this->m_buffers).m_objects._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_sglr::rc::Renderbuffer_*>,_std::_Select1st<std::pair<const_unsigned_int,_sglr::rc::Renderbuffer_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sglr::rc::Renderbuffer_*>_>_>
  ::~_Rb_tree(&(this->m_renderbuffers).m_objects._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_sglr::rc::Framebuffer_*>,_std::_Select1st<std::pair<const_unsigned_int,_sglr::rc::Framebuffer_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sglr::rc::Framebuffer_*>_>_>
  ::~_Rb_tree(&(this->m_framebuffers).m_objects._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_sglr::rc::Texture_*>,_std::_Select1st<std::pair<const_unsigned_int,_sglr::rc::Texture_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sglr::rc::Texture_*>_>_>
  ::~_Rb_tree(&(this->m_textures).m_objects._M_t);
  rc::VertexArray::~VertexArray(&this->m_clientVertexArray);
  ReferenceContextLimits::~ReferenceContextLimits(&this->m_limits);
  return;
}

Assistant:

ReferenceContext::~ReferenceContext (void)
{
	// Destroy all objects -- verifies that ref counting works
	{
		vector<VertexArray*> vertexArrays;
		m_vertexArrays.getAll(vertexArrays);
		for (vector<VertexArray*>::iterator i = vertexArrays.begin(); i != vertexArrays.end(); i++)
			deleteVertexArray(*i);

		DE_ASSERT(m_clientVertexArray.getRefCount() == 1);
	}

	{
		vector<Texture*> textures;
		m_textures.getAll(textures);
		for (vector<Texture*>::iterator i = textures.begin(); i != textures.end(); i++)
			deleteTexture(*i);
	}

	{
		vector<Framebuffer*> framebuffers;
		m_framebuffers.getAll(framebuffers);
		for (vector<Framebuffer*>::iterator i = framebuffers.begin(); i != framebuffers.end(); i++)
			deleteFramebuffer(*i);
	}

	{
		vector<Renderbuffer*> renderbuffers;
		m_renderbuffers.getAll(renderbuffers);
		for (vector<Renderbuffer*>::iterator i = renderbuffers.begin(); i != renderbuffers.end(); i++)
			deleteRenderbuffer(*i);
	}

	{
		vector<DataBuffer*> buffers;
		m_buffers.getAll(buffers);
		for (vector<DataBuffer*>::iterator i = buffers.begin(); i != buffers.end(); i++)
			deleteBuffer(*i);
	}

	{
		vector<ShaderProgramObjectContainer*> programs;
		m_programs.getAll(programs);
		for (vector<ShaderProgramObjectContainer*>::iterator i = programs.begin(); i != programs.end(); i++)
			deleteProgramObject(*i);
	}
}